

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

KeyTimeList * __thiscall
Assimp::FBX::FBXConverter::GetKeyTimeList
          (KeyTimeList *__return_storage_ptr__,FBXConverter *this,KeyFrameListList *inputs)

{
  size_t sVar1;
  KeyFrameListList *this_00;
  bool bVar2;
  unsigned_long *puVar3;
  size_type sVar4;
  const_reference pvVar5;
  __shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var6;
  element_type *peVar7;
  reference pvVar8;
  reference pvVar9;
  size_t *psVar10;
  size_t sVar11;
  KeyFrameList *kfl_2;
  size_t i_1;
  KeyFrameList *kfl_1;
  size_t i;
  int64_t min_tick;
  size_t count;
  undefined1 local_80 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> next_pos;
  size_type local_58;
  reference local_50;
  KeyFrameList *kfl;
  const_iterator __end2;
  const_iterator __begin2;
  KeyFrameListList *__range2;
  size_t estimate;
  KeyFrameListList *local_20;
  KeyFrameListList *inputs_local;
  FBXConverter *this_local;
  KeyTimeList *keys;
  
  local_20 = inputs;
  inputs_local = (KeyFrameListList *)this;
  this_local = (FBXConverter *)__return_storage_ptr__;
  bVar2 = std::
          vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
          ::empty(inputs);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    estimate._7_1_ = 0;
    std::vector<long,_std::allocator<long>_>::vector(__return_storage_ptr__);
    this_00 = local_20;
    __range2 = (KeyFrameListList *)0x0;
    __end2 = std::
             vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
             ::begin(local_20);
    kfl = (KeyFrameList *)
          std::
          vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
          ::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
                                       *)&kfl), bVar2) {
      local_50 = __gnu_cxx::
                 __normal_iterator<const_std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
                 ::operator*(&__end2);
      p_Var6 = (__shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)std::
                  get<0ul,std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>
                            (local_50);
      peVar7 = std::
               __shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var6);
      local_58 = std::vector<long,_std::allocator<long>_>::size(peVar7);
      puVar3 = std::max<unsigned_long>((unsigned_long *)&__range2,&local_58);
      __range2 = (KeyFrameListList *)*puVar3;
      __gnu_cxx::
      __normal_iterator<const_std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
      ::operator++(&__end2);
    }
    std::vector<long,_std::allocator<long>_>::reserve(__return_storage_ptr__,(size_type)__range2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    sVar4 = std::
            vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
            ::size(local_20);
    count._4_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,sVar4,
               (value_type_conflict1 *)((long)&count + 4));
    min_tick = std::
               vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ::size(local_20);
    while( true ) {
      i = std::numeric_limits<long>::max();
      for (kfl_1 = (KeyFrameList *)0x0; sVar1 = i, kfl_1 < (ulong)min_tick;
          kfl_1 = (KeyFrameList *)
                  ((long)&(kfl_1->
                          super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                          ).
                          super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                          .super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + 1)) {
        pvVar5 = std::
                 vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ::operator[](local_20,(size_type)kfl_1);
        p_Var6 = (__shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)std::
                    get<0ul,std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>
                              (pvVar5);
        peVar7 = std::
                 __shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var6);
        sVar4 = std::vector<long,_std::allocator<long>_>::size(peVar7);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                            (size_type)kfl_1);
        if (*pvVar8 < sVar4) {
          p_Var6 = (__shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)std::
                      get<0ul,std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>
                                (pvVar5);
          peVar7 = std::
                   __shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(p_Var6);
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                              (size_type)kfl_1);
          pvVar9 = std::vector<long,_std::allocator<long>_>::at(peVar7,(ulong)*pvVar8);
          if (*pvVar9 < (long)i) {
            p_Var6 = (__shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)std::
                        get<0ul,std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>
                                  (pvVar5);
            peVar7 = std::
                     __shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->(p_Var6);
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                                (size_type)kfl_1);
            psVar10 = (size_t *)std::vector<long,_std::allocator<long>_>::at(peVar7,(ulong)*pvVar8);
            i = *psVar10;
          }
        }
      }
      sVar11 = std::numeric_limits<long>::max();
      if (sVar1 == sVar11) break;
      std::vector<long,_std::allocator<long>_>::push_back
                (__return_storage_ptr__,(value_type_conflict5 *)&i);
      for (kfl_2 = (KeyFrameList *)0x0; kfl_2 < (ulong)min_tick;
          kfl_2 = (KeyFrameList *)
                  ((long)&(kfl_2->
                          super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                          ).
                          super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                          .super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + 1)) {
        pvVar5 = std::
                 vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ::operator[](local_20,(size_type)kfl_2);
        while( true ) {
          p_Var6 = (__shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)std::
                      get<0ul,std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>
                                (pvVar5);
          peVar7 = std::
                   __shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(p_Var6);
          sVar4 = std::vector<long,_std::allocator<long>_>::size(peVar7);
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                              (size_type)kfl_2);
          bVar2 = false;
          if (*pvVar8 < sVar4) {
            p_Var6 = (__shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)std::
                        get<0ul,std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>
                                  (pvVar5);
            peVar7 = std::
                     __shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->(p_Var6);
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                                (size_type)kfl_2);
            psVar10 = (size_t *)std::vector<long,_std::allocator<long>_>::at(peVar7,(ulong)*pvVar8);
            bVar2 = *psVar10 == i;
          }
          if (!bVar2) break;
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                              (size_type)kfl_2);
          *pvVar8 = *pvVar8 + 1;
        }
      }
    }
    estimate._7_1_ = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    if ((estimate._7_1_ & 1) == 0) {
      std::vector<long,_std::allocator<long>_>::~vector(__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("!inputs.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                ,0xd10,
                "KeyTimeList Assimp::FBX::FBXConverter::GetKeyTimeList(const KeyFrameListList &)");
}

Assistant:

KeyTimeList FBXConverter::GetKeyTimeList(const KeyFrameListList& inputs) {
            ai_assert(!inputs.empty());

            // reserve some space upfront - it is likely that the key-frame lists
            // have matching time values, so max(of all key-frame lists) should
            // be a good estimate.
            KeyTimeList keys;

            size_t estimate = 0;
            for (const KeyFrameList& kfl : inputs) {
                estimate = std::max(estimate, std::get<0>(kfl)->size());
            }

            keys.reserve(estimate);

            std::vector<unsigned int> next_pos;
            next_pos.resize(inputs.size(), 0);

            const size_t count = inputs.size();
            while (true) {

                int64_t min_tick = std::numeric_limits<int64_t>::max();
                for (size_t i = 0; i < count; ++i) {
                    const KeyFrameList& kfl = inputs[i];

                    if (std::get<0>(kfl)->size() > next_pos[i] && std::get<0>(kfl)->at(next_pos[i]) < min_tick) {
                        min_tick = std::get<0>(kfl)->at(next_pos[i]);
                    }
                }

                if (min_tick == std::numeric_limits<int64_t>::max()) {
                    break;
                }
                keys.push_back(min_tick);

                for (size_t i = 0; i < count; ++i) {
                    const KeyFrameList& kfl = inputs[i];


                    while (std::get<0>(kfl)->size() > next_pos[i] && std::get<0>(kfl)->at(next_pos[i]) == min_tick) {
                        ++next_pos[i];
                    }
                }
            }

            return keys;
        }